

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brg_sha1.c
# Opt level: O0

void rng_spawn(RNG_state *mystate,RNG_state *newstate,int spawnnumber)

{
  uchar local_7c;
  undefined1 local_7b;
  undefined1 local_7a;
  undefined1 local_79;
  undefined1 local_78 [4];
  uint_8t bytes [4];
  sha1_ctx_s ctx;
  int spawnnumber_local;
  RNG_state *newstate_local;
  RNG_state *mystate_local;
  
  local_7c = (uchar)((uint)spawnnumber >> 0x18);
  local_7b = (undefined1)((uint)spawnnumber >> 0x10);
  local_7a = (undefined1)((uint)spawnnumber >> 8);
  local_79 = (undefined1)spawnnumber;
  sha1_begin((sha1_ctx *)local_78);
  sha1_hash(mystate,0x14,(sha1_ctx *)local_78);
  sha1_hash(&local_7c,4,(sha1_ctx *)local_78);
  sha1_end(newstate,(sha1_ctx *)local_78);
  return;
}

Assistant:

void rng_spawn(RNG_state *mystate, RNG_state *newstate, int spawnnumber)
{
	struct sha1_context ctx;
	uint_8t  bytes[4];
	
	bytes[0] = 0xFF & (spawnnumber >> 24);
	bytes[1] = 0xFF & (spawnnumber >> 16);
	bytes[2] = 0xFF & (spawnnumber >> 8);
	bytes[3] = 0xFF & spawnnumber;
	
	sha1_begin(&ctx);
	sha1_hash(mystate, 20, &ctx);
	sha1_hash(bytes, 4, &ctx);
	sha1_end(newstate, &ctx);
}